

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindSamplersTest::iterate(FunctionalBindSamplersTest *this)

{
  ostringstream *this_00;
  Context *pCVar1;
  char cVar2;
  GLint i_3;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  TestError *this_01;
  GLint i;
  long lVar6;
  GLint i_2;
  GLuint GVar7;
  uint uVar8;
  GLint i_1;
  GLuint index;
  long lVar9;
  GLint max_samplers;
  long local_218;
  GLuint local_20c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_sampler_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sampler_ids;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  max_samplers = 0;
  (**(code **)(lVar9 + 0x868))(0x8b4d,&max_samplers);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb60);
  sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&sampler_ids,(long)max_samplers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&t_sampler_ids,(long)max_samplers);
  for (lVar6 = 0; lVar6 < max_samplers; lVar6 = lVar6 + 1) {
    t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] = 0;
  }
  (**(code **)(lVar9 + 0x6f0))
            ((long)max_samplers,
             sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"GenSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb70);
  (**(code **)(lVar9 + 0xb0))
            (0,max_samplers,
             sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb78);
  local_218 = lVar9;
  for (lVar6 = 0; lVar9 = local_218, lVar6 < max_samplers; lVar6 = lVar6 + 1) {
    pCVar1 = (this->super_TestCase).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Sampler",(allocator<char> *)&local_1d0);
    checkBinding(pCVar1,0x8919,(GLuint)lVar6,(string *)local_1b0,
                 sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar6]);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  GVar5 = (GLuint)((long)max_samplers / 2);
  (**(code **)(local_218 + 0xb0))
            (0,(long)max_samplers / 2 & 0xffffffff,
             t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb86);
  index = 0;
  GVar7 = 0;
  if (0 < (int)GVar5) {
    GVar7 = GVar5;
  }
  local_20c = GVar5;
  for (; GVar7 != index; index = index + 1) {
    pCVar1 = (this->super_TestCase).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Sampler",(allocator<char> *)&local_1d0);
    checkBinding(pCVar1,0x8919,index,(string *)local_1b0,0);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  for (lVar9 = (long)(int)local_20c; lVar6 = local_218, lVar9 < max_samplers; lVar9 = lVar9 + 1) {
    pCVar1 = (this->super_TestCase).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Sampler",(allocator<char> *)&local_1d0);
    checkBinding(pCVar1,0x8919,(GLuint)lVar9,(string *)local_1b0,
                 sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar9]);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  (**(code **)(local_218 + 0xb0))(local_20c,max_samplers - local_20c,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb97);
  for (GVar7 = 0; lVar9 = local_218, (int)GVar7 < max_samplers; GVar7 = GVar7 + 1) {
    pCVar1 = (this->super_TestCase).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Sampler",(allocator<char> *)&local_1d0);
    checkBinding(pCVar1,0x8919,GVar7,(string *)local_1b0,0);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  uVar8 = 1;
  while( true ) {
    cVar2 = (**(code **)(lVar9 + 0xcb0))(uVar8);
    if (cVar2 != '\x01') break;
    uVar8 = uVar8 + 1;
  }
  *t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uVar8;
  for (lVar6 = 1; lVar6 < max_samplers; lVar6 = lVar6 + 1) {
    t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] =
         sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar6];
  }
  (**(code **)(lVar9 + 0xb0))(0);
  local_1d0.m_value = (**(code **)(lVar9 + 0x800))();
  if (local_1d0.m_value == 0x502) {
    *t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
    for (lVar9 = 0; lVar6 = local_218, lVar9 < max_samplers; lVar9 = lVar9 + 1) {
      pCVar1 = (this->super_TestCase).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"Sampler",(allocator<char> *)&local_1d0);
      checkBinding(pCVar1,0x8919,(GLuint)lVar9,(string *)local_1b0,
                   t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar9]);
      std::__cxx11::string::~string((string *)local_1b0);
    }
    (**(code **)(local_218 + 0xb0))(0,(long)max_samplers,0);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"BindSamplers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xbc5);
    (**(code **)(lVar6 + 0x468))(max_samplers);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return STOP;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"File: ");
  std::operator<<((ostream *)this_00,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 );
  std::operator<<((ostream *)this_00,", line: ");
  std::ostream::operator<<(this_00,0xbb9);
  std::operator<<((ostream *)this_00,". Got wrong error: ");
  local_1d0.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", expected: ");
  local_1c0.m_getName = glu::getErrorName;
  local_1c0.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", message: ");
  std::operator<<((ostream *)this_00,"BindSamplers with invalid sampler id");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xbb9);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindSamplersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLuint invalid_id   = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_samplers = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_samplers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	std::vector<GLuint> sampler_ids;
	std::vector<GLuint> t_sampler_ids;

	sampler_ids.resize(max_samplers);
	t_sampler_ids.resize(max_samplers);

	for (GLint i = 0; i < max_samplers; ++i)
	{
		t_sampler_ids[i] = 0;
	}

	/* Prepare samplers */
	gl.genSamplers(max_samplers, &sampler_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenSamplers");

	try
	{
		/* - execute BindSamplers to bind all samplers;
		 * - inspect bindings to verify that proper samplers were set;
		 */
		gl.bindSamplers(0 /* first */, max_samplers /* count */, &sampler_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", sampler_ids[i]);
		}

		/* - execute BindSamplers for first half of bindings with <samplers> filled
		 * with zeros, to unbind those samplers;
		 * - inspect bindings to verify that proper samplers were unbound;
		 */
		GLint half_index = max_samplers / 2;

		gl.bindSamplers(0, half_index, &t_sampler_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < half_index; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", 0);
		}

		for (GLint i = half_index; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", sampler_ids[i]);
		}

		/* - execute BindSamplers for second half of bindings with NULL as <samplers>,
		 * to unbind those samplers;
		 * - inspect bindings to verify that proper samplers were unbound;
		 */
		gl.bindSamplers(half_index, max_samplers - half_index, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", 0);
		}

		/* - modify <samplers> so first entry is invalid;
		 * - execute BindSamplers to bind all samplers; It is expected that
		 * INVALID_OPERATION will be generated;
		 * - inspect bindings to verify that proper samplers were set;
		 */

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isSampler(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		/* Prepare ids */
		t_sampler_ids[0] = invalid_id;

		for (GLint i = 1; i < max_samplers; ++i)
		{
			t_sampler_ids[i] = sampler_ids[i];
		}

		/* Bind */
		gl.bindSamplers(0, max_samplers, &t_sampler_ids[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindSamplers with invalid sampler id");

		/* Set 0 for invalid entry */
		t_sampler_ids[0] = 0;

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", t_sampler_ids[i]);
		}

		/* - unbind all samplers. */
		gl.bindSamplers(0, max_samplers, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");
	}
	catch (const std::exception&)
	{
		gl.deleteSamplers(max_samplers, &sampler_ids[0]);

		TCU_FAIL("Invalid error generated");
	}

	/* Delete samplers */
	gl.deleteSamplers(max_samplers, &sampler_ids[0]);

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}